

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaPrivate::internalRaise(QMdiAreaPrivate *this,QMdiSubWindow *mdiChild)

{
  long lVar1;
  QArrayData *pQVar2;
  long lVar3;
  bool bVar4;
  qsizetype qVar5;
  int __sig;
  QWidget **u;
  long lVar6;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QWidget *local_50;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __sig = 0x6e9562;
  bVar4 = sanityCheck(mdiChild,"QMdiArea::internalRaise");
  if ((bVar4) && (1 < (ulong)(this->childWindows).d.size)) {
    if ((mdiChild == (QMdiSubWindow *)0x0) ||
       (((((mdiChild->super_QWidget).data)->window_flags).
         super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i &
        0x40000) == 0)) {
      lVar1 = *(long *)&((this->super_QAbstractScrollAreaPrivate).viewport)->field_0x8;
      pQVar2 = *(QArrayData **)(lVar1 + 0x18);
      lVar3 = *(long *)(lVar1 + 0x20);
      lVar1 = *(long *)(lVar1 + 0x28);
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (lVar1 == 0) {
        local_50 = (QWidget *)0x0;
      }
      else {
        lVar6 = 0;
        local_50 = (QWidget *)0x0;
        do {
          __sig = (int)*(undefined8 *)(lVar3 + lVar6);
          local_40 = (QWidget *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
          if (local_40 != (QWidget *)0x0) {
            u = &local_40;
            qVar5 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                              (&this->childWindows,(QMdiSubWindow **)u,0);
            __sig = (int)u;
            if ((((qVar5 != -1) && (local_40 != (QWidget *)0x0)) &&
                ((local_40->data->widget_attributes & 0x10000) == 0)) &&
               (((local_40->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                 super_QFlagsStorage<Qt::WindowType>.i & 0x40000) != 0)) {
              if (local_50 == (QWidget *)0x0) {
                QWidget::raise(local_40,0);
                __sig = (int)local_50;
              }
              else {
                QWidget::stackUnder(local_40,local_50);
                __sig = (int)local_50;
              }
              local_50 = local_40;
            }
          }
          lVar6 = lVar6 + 8;
        } while (lVar1 << 3 != lVar6);
      }
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          __sig = 8;
          QArrayData::deallocate(pQVar2,8,0x10);
        }
      }
    }
    else {
      local_50 = (QWidget *)0x0;
    }
    if (local_50 == (QWidget *)0x0) {
      QWidget::raise(&mdiChild->super_QWidget,__sig);
    }
    else {
      QWidget::stackUnder(&mdiChild->super_QWidget,local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::internalRaise(QMdiSubWindow *mdiChild) const
{
    if (!sanityCheck(mdiChild, "QMdiArea::internalRaise") || childWindows.size() < 2)
        return;

    QMdiSubWindow *stackUnderChild = nullptr;
    if (!windowStaysOnTop(mdiChild)) {
        const auto children = viewport->children(); // take a copy, as raising/stacking under changes the order
        for (QObject *object : children) {
            QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(object);
            if (!child || !childWindows.contains(child))
                continue;
            if (!child->isHidden() && windowStaysOnTop(child)) {
                if (stackUnderChild)
                    child->stackUnder(stackUnderChild);
                else
                    child->raise();
                stackUnderChild = child;
            }
        }
    }

    if (stackUnderChild)
        mdiChild->stackUnder(stackUnderChild);
    else
        mdiChild->raise();
}